

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSession.cpp
# Opt level: O3

void __thiscall ki::protocol::net::ServerSession::on_connected(ServerSession *this)

{
  undefined8 uVar1;
  long lVar2;
  int timestamp;
  SessionOffer offer;
  SessionOffer SStack_28;
  
  uVar1 = std::chrono::_V2::steady_clock::now();
  *(undefined8 *)(&this->field_0x18 + (long)this->_vptr_ServerSession[-3]) = uVar1;
  lVar2 = std::chrono::_V2::system_clock::now();
  timestamp = (int)(SUB168(SEXT816(lVar2) * SEXT816(0x112e0be826d694b3),8) >> 0x1a) -
              (SUB164(SEXT816(lVar2) * SEXT816(0x112e0be826d694b3),0xc) >> 0x1f);
  control::SessionOffer::SessionOffer
            (&SStack_28,*(uint16_t *)(&this->field_0x8 + (long)this->_vptr_ServerSession[-3]),
             timestamp,
             timestamp * -1000 +
             ((int)(SUB168(SEXT816(lVar2) * SEXT816(0x431bde82d7b634db),8) >> 0x12) -
             (SUB164(SEXT816(lVar2) * SEXT816(0x431bde82d7b634db),0xc) >> 0x1f)));
  Session::send_packet
            ((Session *)((long)&this->_vptr_ServerSession + (long)this->_vptr_ServerSession[-3]),
             true,'\0',&SStack_28.super_Serializable);
  return;
}

Assistant:

void ServerSession::on_connected()
	{
		m_connection_time = std::chrono::steady_clock::now();

		// Work out the current timestamp and how many milliseconds 
		// have elapsed in the current second. 
		auto now = std::chrono::system_clock::now();
		const auto timestamp = std::chrono::duration_cast<std::chrono::seconds>(
			now.time_since_epoch()
		).count();
		const auto milliseconds = std::chrono::duration_cast<std::chrono::milliseconds>(
			now.time_since_epoch()
		).count() - (timestamp * 1000);

		// Send a SESSION_OFFER packet to the client 
		const control::SessionOffer offer(m_id, timestamp, milliseconds);
		send_packet(true, (uint8_t)control::Opcode::SESSION_OFFER, offer);
	}